

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorPool::Tables::Tables(Tables *this)

{
  _Rb_tree_header *p_Var1;
  allocator_type local_57;
  key_equal local_56;
  hash<const_char_*> local_55;
  allocator_type local_54;
  key_equal local_53;
  hash<const_char_*> local_52;
  allocator_type local_51;
  key_equal local_50;
  hash<const_google::protobuf::Descriptor_*> local_4f;
  allocator_type local_4e;
  key_equal local_4d;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4c;
  allocator_type local_4b;
  key_equal local_4a;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_49 [25];
  
  (this->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->known_bad_files_)._M_h,3,local_49,&local_4a,&local_4b);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->known_bad_symbols_)._M_h,3,&local_4c,&local_4d,&local_4e);
  std::
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&(this->extensions_loaded_from_db_)._M_h,3,&local_4f,&local_50,&local_51);
  (this->file_tables_).
  super__Vector_base<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>,_std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->file_tables_).
  super__Vector_base<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>,_std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->once_dynamics_).
  super__Vector_base<std::unique_ptr<std::once_flag,_std::default_delete<std::once_flag>_>,_std::allocator<std::unique_ptr<std::once_flag,_std::default_delete<std::once_flag>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->once_dynamics_).
  super__Vector_base<std::unique_ptr<std::once_flag,_std::default_delete<std::once_flag>_>,_std::allocator<std::unique_ptr<std::once_flag,_std::default_delete<std::once_flag>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->messages_).
  super__Vector_base<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->once_dynamics_).
  super__Vector_base<std::unique_ptr<std::once_flag,_std::default_delete<std::once_flag>_>,_std::allocator<std::unique_ptr<std::once_flag,_std::default_delete<std::once_flag>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->messages_).
  super__Vector_base<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->messages_).
  super__Vector_base<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->strings_).
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->strings_).
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->allocations_).
  super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->strings_).
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->allocations_).
  super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->allocations_).
  super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->file_tables_).
  super__Vector_base<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>,_std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->symbols_by_name_)._M_h,3,&local_52,&local_53,&local_54);
  std::
  _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->files_by_name_)._M_h,3,&local_55,&local_56,&local_57);
  p_Var1 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->checkpoints_).
  super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->checkpoints_).
  super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->checkpoints_).
  super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->symbols_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symbols_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->symbols_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->files_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->files_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extensions_after_checkpoint_).
  super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extensions_after_checkpoint_).
  super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extensions_after_checkpoint_).
  super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

DescriptorPool::Tables::Tables()
    // Start some hash-map and hash-set objects with a small # of buckets
    : known_bad_files_(3),
      known_bad_symbols_(3),
      extensions_loaded_from_db_(3),
      symbols_by_name_(3),
      files_by_name_(3) {}